

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall Database::load_iterator(Database *this,DatabaseName *name)

{
  source_loc loc;
  logger *this_00;
  string_view_t fmt;
  OnDiskIterator local_188;
  
  OnDiskIterator::load(&local_188,name);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OnDiskIterator>,std::_Select1st<std::pair<std::__cxx11::string_const,OnDiskIterator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OnDiskIterator>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,OnDiskIterator>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OnDiskIterator>,std::_Select1st<std::pair<std::__cxx11::string_const,OnDiskIterator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OnDiskIterator>>>
              *)&this->iterators,&name->id,&local_188);
  OnDiskIterator::~OnDiskIterator(&local_188);
  this_00 = spdlog::default_logger_raw();
  local_188.name.db_base._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_188.name.db_base._M_pathname._M_string_length = 0;
  local_188.name.db_base._M_pathname.field_2._M_allocated_capacity = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 8;
  fmt.data_ = "LOAD: {}";
  spdlog::logger::log<std::__cxx11::string>(this_00,loc,info,fmt,&name->filename);
  return;
}

Assistant:

void Database::load_iterator(const DatabaseName &name) {
    iterators.emplace(name.get_id(), OnDiskIterator::load(name));
    spdlog::info("LOAD: {}", name.get_filename());
}